

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void getNameAndString(int argc,char **argv,int *i,int part,SetAttrVector *attrs)

{
  invalid_argument *this;
  SetAttr *this_00;
  undefined4 in_ECX;
  int *in_RDX;
  long in_RSI;
  int in_EDI;
  char *str;
  char *attrName;
  value_type *__x;
  vector<SetAttr,_std::allocator<SetAttr>_> *this_01;
  undefined4 in_stack_ffffffffffffff08;
  allocator<char> *in_stack_ffffffffffffff30;
  undefined6 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3e;
  undefined1 uVar1;
  allocator<char> in_stack_ffffffffffffff3f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  allocator<char> local_99;
  string local_98 [80];
  value_type *local_48;
  undefined8 local_40;
  undefined4 local_1c;
  int *local_18;
  
  if (in_EDI + -3 < *in_RDX) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Expected a name and string");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_40 = *(undefined8 *)(in_RSI + 8 + (long)*in_RDX * 8);
  local_48 = *(value_type **)(in_RSI + 0x10 + (long)*in_RDX * 8);
  local_1c = in_ECX;
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff40,
             (char *)CONCAT17(in_stack_ffffffffffffff3f,
                              CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)),
             in_stack_ffffffffffffff30);
  this_00 = (SetAttr *)operator_new(0x28);
  uVar1 = 1;
  this_01 = (vector<SetAttr,_std::allocator<SetAttr>_> *)&stack0xffffffffffffff3f;
  __x = local_48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff40,
             (char *)CONCAT17(in_stack_ffffffffffffff3f,CONCAT16(uVar1,in_stack_ffffffffffffff38)),
             in_stack_ffffffffffffff30);
  Imf_3_3::
  TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  TypedAttribute((TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(local_1c,in_stack_ffffffffffffff08));
  SetAttr::SetAttr(this_00,(string *)CONCAT44(local_1c,in_stack_ffffffffffffff08),
                   (int)((ulong)this_01 >> 0x20),(Attribute *)__x);
  std::vector<SetAttr,_std::allocator<SetAttr>_>::push_back(this_01,__x);
  SetAttr::~SetAttr((SetAttr *)0x1192c7);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff3f);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  *local_18 = *local_18 + 3;
  return;
}

Assistant:

void
getNameAndString (int argc, char** argv, int& i, int part, SetAttrVector& attrs)
{
    if (i > argc - 3) throw invalid_argument ("Expected a name and string");

    const char* attrName = argv[i + 1];
    const char* str      = argv[i + 2];
    attrs.push_back (SetAttr (attrName, part, new StringAttribute (str)));
    i += 3;
}